

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

void __thiscall
cmGraphVizWriter::ReadSettings
          (cmGraphVizWriter *this,char *settingsFileName,char *fallbackSettingsFileName)

{
  pointer pbVar1;
  bool bVar2;
  cmLocalGenerator *pcVar3;
  ostream *poVar4;
  char *pcVar5;
  pointer s;
  string ignoreTargetsRegexes;
  RegularExpression currentRegex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreTargetsRegExVector;
  cmMakefile mf;
  cmake cm;
  cmGlobalGenerator ggi;
  
  cmake::cmake(&cm,RoleScript,Unknown);
  std::__cxx11::string::string<std::allocator<char>>((string *)&mf,"",(allocator<char> *)&ggi);
  cmake::SetHomeDirectory(&cm,(string *)&mf);
  std::__cxx11::string::~string((string *)&mf);
  std::__cxx11::string::string<std::allocator<char>>((string *)&mf,"",(allocator<char> *)&ggi);
  cmake::SetHomeOutputDirectory(&cm,(string *)&mf);
  std::__cxx11::string::~string((string *)&mf);
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)cm.CurrentSnapshot.Position.Position;
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)cm.CurrentSnapshot.State;
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = (size_t)cm.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&mf);
  cmGlobalGenerator::cmGlobalGenerator(&ggi,&cm);
  currentRegex.regmatch.startp[2] = (char *)cm.CurrentSnapshot.Position.Position;
  currentRegex.regmatch.startp[0] = (char *)cm.CurrentSnapshot.State;
  currentRegex.regmatch.startp[1] = (char *)cm.CurrentSnapshot.Position.Tree;
  cmMakefile::cmMakefile(&mf,&ggi,(cmStateSnapshot *)&currentRegex);
  pcVar3 = cmGlobalGenerator::CreateLocalGenerator(&ggi,&mf);
  bVar2 = cmsys::SystemTools::FileExists(settingsFileName);
  if (!bVar2) {
    bVar2 = cmsys::SystemTools::FileExists(fallbackSettingsFileName);
    settingsFileName = fallbackSettingsFileName;
    if (!bVar2) goto LAB_002c0669;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&currentRegex,settingsFileName,(allocator<char> *)&ignoreTargetsRegexes);
  bVar2 = cmMakefile::ReadListFile(&mf,(string *)&currentRegex);
  std::__cxx11::string::~string((string *)&currentRegex);
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Reading GraphViz options file: ");
    poVar4 = std::operator<<(poVar4,settingsFileName);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_GRAPH_TYPE",
               (allocator<char> *)&ignoreTargetsRegexes);
    pcVar5 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::assign((char *)this);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_GRAPH_NAME",
               (allocator<char> *)&ignoreTargetsRegexes);
    pcVar5 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&this->GraphName);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_GRAPH_HEADER",
               (allocator<char> *)&ignoreTargetsRegexes);
    pcVar5 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&this->GraphHeader);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_NODE_PREFIX",
               (allocator<char> *)&ignoreTargetsRegexes);
    pcVar5 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&this->GraphNodePrefix);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_EXECUTABLES",
               (allocator<char> *)&ignoreTargetsRegexes);
    pcVar5 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&currentRegex,"GRAPHVIZ_EXECUTABLES",
                 (allocator<char> *)&ignoreTargetsRegexes);
      bVar2 = cmMakefile::IsOn(&mf,(string *)&currentRegex);
      this->GenerateForExecutables = bVar2;
      std::__cxx11::string::~string((string *)&currentRegex);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_STATIC_LIBS",
               (allocator<char> *)&ignoreTargetsRegexes);
    pcVar5 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&currentRegex,"GRAPHVIZ_STATIC_LIBS",
                 (allocator<char> *)&ignoreTargetsRegexes);
      bVar2 = cmMakefile::IsOn(&mf,(string *)&currentRegex);
      this->GenerateForStaticLibs = bVar2;
      std::__cxx11::string::~string((string *)&currentRegex);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_SHARED_LIBS",
               (allocator<char> *)&ignoreTargetsRegexes);
    pcVar5 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&currentRegex,"GRAPHVIZ_SHARED_LIBS",
                 (allocator<char> *)&ignoreTargetsRegexes);
      bVar2 = cmMakefile::IsOn(&mf,(string *)&currentRegex);
      this->GenerateForSharedLibs = bVar2;
      std::__cxx11::string::~string((string *)&currentRegex);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_MODULE_LIBS",
               (allocator<char> *)&ignoreTargetsRegexes);
    pcVar5 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&currentRegex,"GRAPHVIZ_MODULE_LIBS",
                 (allocator<char> *)&ignoreTargetsRegexes);
      bVar2 = cmMakefile::IsOn(&mf,(string *)&currentRegex);
      this->GenerateForModuleLibs = bVar2;
      std::__cxx11::string::~string((string *)&currentRegex);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_INTERFACE",(allocator<char> *)&ignoreTargetsRegexes
              );
    pcVar5 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&currentRegex,"GRAPHVIZ_INTERFACE",
                 (allocator<char> *)&ignoreTargetsRegexes);
      bVar2 = cmMakefile::IsOn(&mf,(string *)&currentRegex);
      this->GenerateForInterface = bVar2;
      std::__cxx11::string::~string((string *)&currentRegex);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_EXTERNAL_LIBS",
               (allocator<char> *)&ignoreTargetsRegexes);
    pcVar5 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&currentRegex,"GRAPHVIZ_EXTERNAL_LIBS",
                 (allocator<char> *)&ignoreTargetsRegexes);
      bVar2 = cmMakefile::IsOn(&mf,(string *)&currentRegex);
      this->GenerateForExternals = bVar2;
      std::__cxx11::string::~string((string *)&currentRegex);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_GENERATE_PER_TARGET",
               (allocator<char> *)&ignoreTargetsRegexes);
    pcVar5 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&currentRegex,"GRAPHVIZ_GENERATE_PER_TARGET",
                 (allocator<char> *)&ignoreTargetsRegexes);
      bVar2 = cmMakefile::IsOn(&mf,(string *)&currentRegex);
      this->GeneratePerTarget = bVar2;
      std::__cxx11::string::~string((string *)&currentRegex);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_GENERATE_DEPENDERS",
               (allocator<char> *)&ignoreTargetsRegexes);
    pcVar5 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&currentRegex,"GRAPHVIZ_GENERATE_DEPENDERS",
                 (allocator<char> *)&ignoreTargetsRegexes);
      bVar2 = cmMakefile::IsOn(&mf,(string *)&currentRegex);
      this->GenerateDependers = bVar2;
      std::__cxx11::string::~string((string *)&currentRegex);
    }
    ignoreTargetsRegexes._M_dataplus._M_p = (pointer)&ignoreTargetsRegexes.field_2;
    ignoreTargetsRegexes._M_string_length = 0;
    ignoreTargetsRegexes.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_IGNORE_TARGETS",
               (allocator<char> *)&ignoreTargetsRegExVector);
    pcVar5 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&ignoreTargetsRegexes);
    }
    std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
              (&this->TargetsToIgnoreRegex);
    if (ignoreTargetsRegexes._M_string_length != 0) {
      ignoreTargetsRegExVector.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ignoreTargetsRegExVector.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ignoreTargetsRegExVector.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmSystemTools::ExpandListArgument(&ignoreTargetsRegexes,&ignoreTargetsRegExVector,false);
      pbVar1 = ignoreTargetsRegExVector.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (s = ignoreTargetsRegExVector.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; s != pbVar1; s = s + 1) {
        currentRegex.regmatch.startp[0] = (char *)0x0;
        currentRegex.regmatch.endp[0] = (char *)0x0;
        currentRegex.regmatch.searchstring = (char *)0x0;
        currentRegex.program = (char *)0x0;
        bVar2 = cmsys::RegularExpression::compile(&currentRegex,s);
        if (!bVar2) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Could not compile bad regex \"");
          poVar4 = std::operator<<(poVar4,(string *)s);
          poVar4 = std::operator<<(poVar4,"\"");
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
        emplace_back<cmsys::RegularExpression>(&this->TargetsToIgnoreRegex,&currentRegex);
        cmsys::RegularExpression::~RegularExpression(&currentRegex);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&ignoreTargetsRegExVector);
    }
    std::__cxx11::string::~string((string *)&ignoreTargetsRegexes);
  }
  else {
    cmSystemTools::Error
              ("Problem opening GraphViz options file: ",settingsFileName,(char *)0x0,(char *)0x0);
  }
LAB_002c0669:
  if (pcVar3 != (cmLocalGenerator *)0x0) {
    (*pcVar3->_vptr_cmLocalGenerator[1])(pcVar3);
  }
  cmMakefile::~cmMakefile(&mf);
  cmGlobalGenerator::~cmGlobalGenerator(&ggi);
  cmake::~cmake(&cm);
  return;
}

Assistant:

void cmGraphVizWriter::ReadSettings(const char* settingsFileName,
                                    const char* fallbackSettingsFileName)
{
  cmake cm(cmake::RoleScript, cmState::Unknown);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator ggi(&cm);
  cmMakefile mf(&ggi, cm.GetCurrentSnapshot());
  std::unique_ptr<cmLocalGenerator> lg(ggi.CreateLocalGenerator(&mf));

  const char* inFileName = settingsFileName;

  if (!cmSystemTools::FileExists(inFileName)) {
    inFileName = fallbackSettingsFileName;
    if (!cmSystemTools::FileExists(inFileName)) {
      return;
    }
  }

  if (!mf.ReadListFile(inFileName)) {
    cmSystemTools::Error("Problem opening GraphViz options file: ",
                         inFileName);
    return;
  }

  std::cout << "Reading GraphViz options file: " << inFileName << std::endl;

#define __set_if_set(var, cmakeDefinition)                                    \
  do {                                                                        \
    const char* value = mf.GetDefinition(cmakeDefinition);                    \
    if (value) {                                                              \
      (var) = value;                                                          \
    }                                                                         \
  } while (false)

  __set_if_set(this->GraphType, "GRAPHVIZ_GRAPH_TYPE");
  __set_if_set(this->GraphName, "GRAPHVIZ_GRAPH_NAME");
  __set_if_set(this->GraphHeader, "GRAPHVIZ_GRAPH_HEADER");
  __set_if_set(this->GraphNodePrefix, "GRAPHVIZ_NODE_PREFIX");

#define __set_bool_if_set(var, cmakeDefinition)                               \
  do {                                                                        \
    const char* value = mf.GetDefinition(cmakeDefinition);                    \
    if (value) {                                                              \
      (var) = mf.IsOn(cmakeDefinition);                                       \
    }                                                                         \
  } while (false)

  __set_bool_if_set(this->GenerateForExecutables, "GRAPHVIZ_EXECUTABLES");
  __set_bool_if_set(this->GenerateForStaticLibs, "GRAPHVIZ_STATIC_LIBS");
  __set_bool_if_set(this->GenerateForSharedLibs, "GRAPHVIZ_SHARED_LIBS");
  __set_bool_if_set(this->GenerateForModuleLibs, "GRAPHVIZ_MODULE_LIBS");
  __set_bool_if_set(this->GenerateForInterface, "GRAPHVIZ_INTERFACE");
  __set_bool_if_set(this->GenerateForExternals, "GRAPHVIZ_EXTERNAL_LIBS");
  __set_bool_if_set(this->GeneratePerTarget, "GRAPHVIZ_GENERATE_PER_TARGET");
  __set_bool_if_set(this->GenerateDependers, "GRAPHVIZ_GENERATE_DEPENDERS");

  std::string ignoreTargetsRegexes;
  __set_if_set(ignoreTargetsRegexes, "GRAPHVIZ_IGNORE_TARGETS");

  this->TargetsToIgnoreRegex.clear();
  if (!ignoreTargetsRegexes.empty()) {
    std::vector<std::string> ignoreTargetsRegExVector;
    cmSystemTools::ExpandListArgument(ignoreTargetsRegexes,
                                      ignoreTargetsRegExVector);
    for (std::string const& currentRegexString : ignoreTargetsRegExVector) {
      cmsys::RegularExpression currentRegex;
      if (!currentRegex.compile(currentRegexString)) {
        std::cerr << "Could not compile bad regex \"" << currentRegexString
                  << "\"" << std::endl;
      }
      this->TargetsToIgnoreRegex.push_back(std::move(currentRegex));
    }
  }
}